

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4b5);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,
                        "AddCleared() can only be used on a RepeatedPtrField not on an arena.");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size == this->total_size_)) {
    Reserve(this,this->total_size_ + 1);
  }
  pRVar2 = this->rep_;
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + 1;
  pRVar2->elements[iVar1] = value;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetOwningArena(value) == nullptr)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}